

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O1

void __thiscall shared_ptr_empty_ptr_Test::TestBody(shared_ptr_empty_ptr_Test *this)

{
  Struct *pSVar1;
  AssertHelper AVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  bool bVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  AssertionResult gtest_ar_15;
  shared_ptr<Struct> zPtr;
  AssertionResult gtest_ar;
  shared_ptr<Struct> xPtr;
  AssertHelper local_78;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  shared_ptr<Struct> local_60;
  AssertHelper local_50;
  AssertHelper local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_40;
  shared_ptr<Struct> local_38;
  shared_ptr<Struct> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_28.px = (Struct *)0x0;
  local_48.data_ = local_48.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
            ((internal *)&local_38,"false","xPtr",(bool *)&local_48,&local_28);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)&(local_38.px)->mVal;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x32,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_48.data_ + 8))();
      }
      local_48.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_ = local_48.data_ & 0xffffffffffffff00;
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
  }
  local_70.data_._0_1_ = (internal)bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_38,"false","xPtr.unique()",(bool *)&local_48,(bool *)&local_70);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)&(local_38.px)->mVal;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x33,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_48.data_ + 8))();
      }
      local_48.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.data_ = local_70.data_ & 0xffffffff00000000;
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_48.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_48.data_ = *(AssertHelperData **)local_28.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_38,"0","xPtr.use_count()",(int *)&local_70,(long *)&local_48);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)&(local_38.px)->mVal;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x34,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_48.data_ + 8))();
      }
      local_48.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_ = (AssertHelperData *)0x0;
  local_70.data_ = (AssertHelperData *)local_28.px;
  testing::internal::CmpHelperEQ<void*,Struct*>
            ((internal *)&local_38,"(void*)__null","xPtr.get()",&local_48.data_,(Struct **)&local_70
            );
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)&(local_38.px)->mVal;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x35,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_48.data_ + 8))();
      }
      local_48.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((local_28.super_shared_ptr_base.pn.pn == (long *)0x0) ||
     (*(long *)local_28.super_shared_ptr_base.pn.pn < 1)) {
    shared_ptr_count::release<Struct>((shared_ptr_count *)&local_28,local_28.px);
    local_28.px = (Struct *)0x0;
    local_48.data_ = local_48.data_ & 0xffffffffffffff00;
    testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
              ((internal *)&local_38,"false","xPtr",(bool *)&local_48,&local_28);
    if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_48);
      if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_38.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x3f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_48.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_48.data_ + 8))();
        }
        local_48.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_48.data_ = local_48.data_ & 0xffffffffffffff00;
    if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
    }
    local_70.data_._0_1_ = (internal)bVar3;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_38,"false","xPtr.unique()",(bool *)&local_48,(bool *)&local_70);
    if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_48);
      if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_38.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x40,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_48.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_48.data_ + 8))();
        }
        local_48.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70.data_ = local_70.data_ & 0xffffffff00000000;
    if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
      local_48.data_ = (AssertHelperData *)0x0;
    }
    else {
      local_48.data_ = *(AssertHelperData **)local_28.super_shared_ptr_base.pn.pn;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&local_38,"0","xPtr.use_count()",(int *)&local_70,(long *)&local_48);
    if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_48);
      if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_38.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x41,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_48.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_48.data_ + 8))();
        }
        local_48.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_48.data_ = (AssertHelperData *)0x0;
    local_70.data_ = (AssertHelperData *)local_28.px;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&local_38,"(void*)__null","xPtr.get()",&local_48.data_,
               (Struct **)&local_70);
    if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_48);
      if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_38.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x42,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_48.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_48.data_ + 8))();
        }
        local_48.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    shared_ptr<Struct>::shared_ptr(&local_38,&local_28);
    local_70.data_ = local_70.data_ & 0xffffffffffffff00;
    testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
              ((internal *)&local_48,"false","xPtr",(bool *)&local_70,&local_28);
    if (local_48.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((AssertHelperData *)sStack_40.ptr_ == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((sStack_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x49,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
        local_70.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70.data_ = local_70.data_ & 0xffffffffffffff00;
    if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
    }
    local_50.data_._0_1_ = bVar3;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_48,"false","xPtr.unique()",(bool *)&local_70,(bool *)&local_50);
    if (local_48.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((AssertHelperData *)sStack_40.ptr_ == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((sStack_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
        local_70.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.data_ = local_50.data_ & 0xffffffff00000000;
    if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
      local_70.data_ = (AssertHelperData *)0x0;
    }
    else {
      local_70.data_ = *(AssertHelperData **)local_28.super_shared_ptr_base.pn.pn;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&local_48,"0","xPtr.use_count()",(int *)&local_50,(long *)&local_70);
    if (local_48.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((AssertHelperData *)sStack_40.ptr_ == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((sStack_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
        local_70.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70.data_ = (AssertHelperData *)0x0;
    local_50.data_ = (AssertHelperData *)local_28.px;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&local_48,"(void*)__null","xPtr.get()",&local_70.data_,
               (Struct **)&local_50);
    if (local_48.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((AssertHelperData *)sStack_40.ptr_ == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((sStack_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
        local_70.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70.data_ = local_70.data_ & 0xffffffffffffff00;
    if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = *(long *)local_38.super_shared_ptr_base.pn.pn == 1;
    }
    local_50.data_._0_1_ = bVar3;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_48,"false","yPtr.unique()",(bool *)&local_70,(bool *)&local_50);
    if (local_48.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((AssertHelperData *)sStack_40.ptr_ == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((sStack_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
        local_70.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.data_ = local_50.data_ & 0xffffffff00000000;
    if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
      local_70.data_ = (AssertHelperData *)0x0;
    }
    else {
      local_70.data_ = *(AssertHelperData **)local_38.super_shared_ptr_base.pn.pn;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&local_48,"0","yPtr.use_count()",(int *)&local_50,(long *)&local_70);
    if (local_48.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((AssertHelperData *)sStack_40.ptr_ == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((sStack_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
        local_70.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70.data_ = (AssertHelperData *)0x0;
    local_50.data_ = (AssertHelperData *)local_38.px;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&local_48,"(void*)__null","yPtr.get()",&local_70.data_,
               (Struct **)&local_50);
    if (local_48.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((AssertHelperData *)sStack_40.ptr_ == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((sStack_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
        local_70.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_48.data_ = (AssertHelperData *)0x0;
    sStack_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    shared_ptr<Struct>::shared_ptr(&local_60,&local_28);
    p.ptr_ = sStack_40.ptr_;
    AVar2.data_ = local_48.data_;
    pSVar1 = local_60.px;
    local_60.px = (Struct *)sStack_40.ptr_;
    local_48.data_ = (AssertHelperData *)local_60.super_shared_ptr_base.pn.pn;
    sStack_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar1;
    local_60.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)AVar2.data_;
    shared_ptr_count::release<Struct>((shared_ptr_count *)&local_60,(Struct *)p.ptr_);
    local_60.px = (Struct *)0x0;
    local_50.data_ = local_50.data_ & 0xffffffffffffff00;
    testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
              ((internal *)&local_70,"false","xPtr",(bool *)&local_50,&local_28);
    if (local_70.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x55,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
        local_50.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.data_ = local_50.data_ & 0xffffffffffffff00;
    if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
    }
    local_78.data_._0_1_ = bVar3;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_70,"false","xPtr.unique()",(bool *)&local_50,(bool *)&local_78);
    if (local_70.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x56,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
        local_50.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78.data_ = local_78.data_ & 0xffffffff00000000;
    if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
      local_50.data_ = (AssertHelperData *)0x0;
    }
    else {
      local_50.data_ = *(AssertHelperData **)local_28.super_shared_ptr_base.pn.pn;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&local_70,"0","xPtr.use_count()",(int *)&local_78,(long *)&local_50);
    if (local_70.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x57,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
        local_50.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.data_ = (AssertHelperData *)0x0;
    local_78.data_ = (AssertHelperData *)local_28.px;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&local_70,"(void*)__null","xPtr.get()",&local_50.data_,
               (Struct **)&local_78);
    if (local_70.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x58,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
        local_50.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.data_ = local_50.data_ & 0xffffffffffffff00;
    if (local_48.data_ == (AssertHelperData *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = *(long *)local_48.data_ == 1;
    }
    local_78.data_._0_1_ = bVar3;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_70,"false","zPtr.unique()",(bool *)&local_50,(bool *)&local_78);
    if (local_70.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x59,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
        local_50.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78.data_ = local_78.data_ & 0xffffffff00000000;
    if (local_48.data_ == (AssertHelperData *)0x0) {
      local_50.data_ = (AssertHelperData *)0x0;
    }
    else {
      local_50.data_ = *local_48.data_;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&local_70,"0","zPtr.use_count()",(int *)&local_78,(long *)&local_50);
    if (local_70.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x5a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
        local_50.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.data_ = (AssertHelperData *)0x0;
    local_78.data_ = (AssertHelperData *)sStack_40.ptr_;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&local_70,"(void*)__null","zPtr.get()",&local_50.data_,
               (Struct **)&local_78);
    if (local_70.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x5b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
        local_50.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    shared_ptr_count::release<Struct>((shared_ptr_count *)&local_48,(Struct *)sStack_40.ptr_);
    shared_ptr_count::release<Struct>((shared_ptr_count *)&local_38,local_38.px);
    local_48.data_ = local_48.data_ & 0xffffffffffffff00;
    testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
              ((internal *)&local_38,"false","xPtr",(bool *)&local_48,&local_28);
    if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_48);
      if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_38.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x5f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_48.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_48.data_ + 8))();
        }
        local_48.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_48.data_ = local_48.data_ & 0xffffffffffffff00;
    if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
    }
    local_70.data_._0_1_ = (internal)bVar3;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_38,"false","xPtr.unique()",(bool *)&local_48,(bool *)&local_70);
    if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_48);
      if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_38.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x60,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_48.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_48.data_ + 8))();
        }
        local_48.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70.data_ = local_70.data_ & 0xffffffff00000000;
    if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
      local_48.data_ = (AssertHelperData *)0x0;
    }
    else {
      local_48.data_ = *(AssertHelperData **)local_28.super_shared_ptr_base.pn.pn;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&local_38,"0","xPtr.use_count()",(int *)&local_70,(long *)&local_48);
    if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_48);
      if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_38.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x61,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_48.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_48.data_ + 8))();
        }
        local_48.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_48.data_ = (AssertHelperData *)0x0;
    local_70.data_ = (AssertHelperData *)local_28.px;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&local_38,"(void*)__null","xPtr.get()",&local_48.data_,
               (Struct **)&local_70);
    if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&local_48);
      if ((AssertHelperData *)local_38.px == (AssertHelperData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)&(local_38.px)->mVal;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x62,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_48.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_48.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_48.data_ + 8))();
        }
        local_48.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x39,"bool cast operator error");
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_38.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_38.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_38.super_shared_ptr_base.pn.pn + 8))();
      }
      local_38.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  shared_ptr_count::release<Struct>((shared_ptr_count *)&local_28,local_28.px);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(shared_ptr, empty_ptr)
{
    // Create an empty (ie. NULL) shared_ptr
    shared_ptr<Struct> xPtr;

    EXPECT_EQ(false, xPtr);
    EXPECT_EQ(false, xPtr.unique());
    EXPECT_EQ(0,     xPtr.use_count());
    EXPECT_EQ((void*)NULL,  xPtr.get());

    if (xPtr)
    {
        GTEST_FATAL_FAILURE_("bool cast operator error");
    }

    // Reset to NULL (ie. do nothing)
    xPtr.reset();

    EXPECT_EQ(false, xPtr);
    EXPECT_EQ(false, xPtr.unique());
    EXPECT_EQ(0,     xPtr.use_count());
    EXPECT_EQ((void*)NULL,  xPtr.get());

    // sub-scope
    {
        // Copy construct the empty (ie. NULL) shared_ptr
        shared_ptr<Struct> yPtr(xPtr);

        EXPECT_EQ(false, xPtr);
        EXPECT_EQ(false, xPtr.unique());
        EXPECT_EQ(0,     xPtr.use_count());
        EXPECT_EQ((void*)NULL,  xPtr.get());
        EXPECT_EQ(false, yPtr.unique());
        EXPECT_EQ(0,     yPtr.use_count());
        EXPECT_EQ((void*)NULL,  yPtr.get());

        // Assign the empty (ie. NULL) shared_ptr
        shared_ptr<Struct> zPtr;
        zPtr = xPtr;

        EXPECT_EQ(false, xPtr);
        EXPECT_EQ(false, xPtr.unique());
        EXPECT_EQ(0,     xPtr.use_count());
        EXPECT_EQ((void*)NULL,  xPtr.get());
        EXPECT_EQ(false, zPtr.unique());
        EXPECT_EQ(0,     zPtr.use_count());
        EXPECT_EQ((void*)NULL,  zPtr.get());
    }
    // end of scope

    EXPECT_EQ(false, xPtr);
    EXPECT_EQ(false, xPtr.unique());
    EXPECT_EQ(0,     xPtr.use_count());
    EXPECT_EQ((void*)NULL,  xPtr.get());
}